

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bcj2.c
# Opt level: O0

void Bcj2Dec_Init(CBcj2Dec *p)

{
  uint i;
  CBcj2Dec *p_local;
  
  p->state = 9;
  p->ip = 0;
  p->temp[3] = '\0';
  p->range = 0;
  p->code = 0;
  for (i = 0; i < 0x102; i = i + 1) {
    p->probs[i] = 0x400;
  }
  return;
}

Assistant:

void Bcj2Dec_Init(CBcj2Dec *p)
{
  unsigned i;

  p->state = BCJ2_DEC_STATE_OK;
  p->ip = 0;
  p->temp[3] = 0;
  p->range = 0;
  p->code = 0;
  for (i = 0; i < sizeof(p->probs) / sizeof(p->probs[0]); i++)
    p->probs[i] = kBitModelTotal >> 1;
}